

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_GiveInventoryType
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  PClassActor *type;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  AInventory *val;
  PClassActor *pPVar4;
  char *pcVar5;
  bool bVar6;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      this = (AActor *)(param->field_0).field_1.a;
      if (this != (AActor *)0x0) {
        if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (this->super_DThinker).super_DObject.Class;
        bVar6 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar6) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar6 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar6) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042d5a8;
        }
      }
      if (numparam == 1) {
        pcVar5 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          type = (PClassActor *)param[1].field_0.field_1.a;
          if ((type != (PClassActor *)0x0) &&
             (pPVar4 = type, type != (PClassActor *)AInventory::RegistrationInfo.MyClass)) {
            do {
              pPVar4 = (PClassActor *)(pPVar4->super_PClass).ParentClass;
              if (pPVar4 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
            } while (pPVar4 != (PClassActor *)0x0);
            if (pPVar4 == (PClassActor *)0x0) {
              pcVar5 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AInventory))";
              goto LAB_0042d5e6;
            }
          }
          val = AActor::GiveInventoryType(this,type);
          if (numret < 1) {
            iVar2 = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x465,
                            "int AF_AActor_GiveInventoryType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            iVar2 = 1;
            VMReturn::SetPointer(ret,val,1);
          }
          return iVar2;
        }
        pcVar5 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_0042d5e6:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x464,
                    "int AF_AActor_GiveInventoryType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0042d5a8:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x463,
                "int AF_AActor_GiveInventoryType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GiveInventoryType)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(type, AInventory);
	ACTION_RETURN_OBJECT(self->GiveInventoryType(type));
}